

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::ComputeHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index hI,Index t,Index t_offset,Index *Indices,
          size_t indexDomainSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_R8;
  undefined8 in_R9;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  Index oI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrO;
  size_t vec_size;
  Index remainder;
  Index hI_withinT;
  undefined4 local_44;
  undefined4 local_30;
  
  local_30 = in_ESI - in_ECX;
  for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_R9);
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(ulong)(~local_44 + in_EDX));
    in_ZMM1 = ZEXT1664(auVar2);
    in_ZMM0._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    in_ZMM0._8_56_ = extraout_var;
    uVar4 = vcvttsd2usi_avx512f(in_ZMM0._0_16_);
    iVar3 = (int)(local_30 / uVar4);
    *(int *)(in_R8 + (ulong)local_44 * 4) = iVar3;
    local_30 = local_30 - iVar3 * (int)uVar4;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::ComputeHistoryArrays
    (
        Index hI, //index of the history
        Index t,  //stage of hI
        Index t_offset, //the offset within t
        Index Indices[], //the computed individual indices
        size_t indexDomainSize //the indices range from 0...(indexDomainSize-1)

    ) const
{
    //let's hope the compiler optimizes out the obvious inefficientcies here
    //(I left them for readability)

    //substract the offset to find out what is the index within the 
    //time-step-t-histories.
    Index hI_withinT = hI - t_offset;   
    Index remainder = hI_withinT;
    size_t vec_size = t; // the number of indices  we are searching
    size_t nrO = indexDomainSize;
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // suppose we have a oh = < oI[3], oI[2], o[1], oI[0] >
        // (the numbers represent the stage of the oI)
        // ->then this history is for stage 4 (we have that t=4).
        //
        // the ohI is generated by: 
        //      ohI= oI[3] * nrO^3 + ... +oI[0] * nrO^0
        //
        // we reconstruct this by performing
        // oI[3] = ohI /  nrO^3
        // remainder = ohI - (oI^3)
        // oI[2] = remainder / nrO^2
        // etc.
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrO, (double)(stage));
        Index oI_t2 = remainder / b;
        Indices[t2] = oI_t2;
        remainder -= oI_t2 * b;
    }
}